

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  ostream *poVar1;
  uint uVar2;
  long lVar3;
  ostream oVar4;
  ostream oVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  byte local_41;
  undefined4 local_40;
  uint local_3c;
  char *local_38;
  
  uVar2 = (value->value_).data_;
  pcVar10 = ", -";
  if (-1 < (int)uVar2) {
    pcVar10 = " \t";
  }
  uVar9 = uVar2 >> 0x17 & 0xff;
  uVar6 = uVar2 * 2 & 0xfffffe;
  local_3c = 0;
  if (uVar9 != 0 || uVar6 != 0) {
    local_3c = uVar9 - 0x7f;
  }
  uVar8 = uVar6;
  if ((uVar9 != 0 || uVar6 != 0) && uVar9 == 0) {
    if ((uVar2 >> 0x16 & 1) == 0) {
      uVar8 = uVar2 * 2 & 0x7ffffe;
      uVar7 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar8 = uVar6 << (~(byte)uVar7 + 0x18 & 0x1f);
      local_3c = (local_3c | 8) - (uVar7 ^ 0x1f);
    }
    uVar8 = uVar8 * 2 & 0xfffffc;
  }
  iVar13 = 6;
  if ((uVar8 & 0xe) == 0) {
    uVar14 = (ulong)uVar8;
    iVar12 = iVar13;
    do {
      uVar14 = uVar14 >> 4;
      iVar13 = iVar12 + -1;
      if (iVar12 == 1) break;
      uVar7 = uVar8 & 0xf0;
      uVar8 = (uint)uVar14;
      iVar12 = iVar13;
    } while (uVar7 == 0);
  }
  lVar3 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar3;
  local_40 = *(undefined4 *)(os + lVar3 + 0x18);
  pcVar11 = pcVar10 + 2;
  if (os[lVar3 + 0xe1] == (ostream)0x0) {
    local_38 = pcVar10 + 2;
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
    pcVar11 = local_38;
  }
  oVar4 = poVar1[0xe0];
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,(ulong)(uVar2 >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  local_41 = (uVar9 != 0 || uVar6 != 0) | 0x30;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_41,1);
  if (iVar13 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,".",1);
    lVar3 = *(long *)os;
    *(long *)(os + *(long *)(lVar3 + -0x18) + 0x10) = (long)iVar13;
    lVar3 = *(long *)(lVar3 + -0x18);
    poVar1 = os + lVar3;
    if (os[lVar3 + 0xe1] == (ostream)0x0) {
      oVar5 = (ostream)std::ios::widen((char)poVar1);
      poVar1[0xe0] = oVar5;
      poVar1[0xe1] = (ostream)0x1;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"p",1);
  uVar2 = local_3c;
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar10 = "";
  if (-1 < (int)local_3c) {
    pcVar10 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar10,(ulong)(-1 < (int)local_3c));
  std::ostream::operator<<(os,uVar2);
  lVar3 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar3 + -0x18) + 0x18) = local_40;
  lVar3 = *(long *)(lVar3 + -0x18);
  poVar1 = os + lVar3;
  if (os[lVar3 + 0xe1] == (ostream)0x0) {
    oVar5 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar5;
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = oVar4;
  return os;
}

Assistant:

T value() const { return value_; }